

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

int sigfiddle_doinit(t_sigfiddle *x,long npoints,long npitch,long npeakanal,long npeakout)

{
  int iVar1;
  t_peakout *ptVar2;
  int local_60;
  int local_5c;
  int j;
  int i;
  t_peakout *buf4;
  t_float *buf3;
  t_float *buf2;
  t_float *buf1;
  long npeakout_local;
  long npeakanal_local;
  long npitch_local;
  long npoints_local;
  t_sigfiddle *x_local;
  
  buf1 = (t_float *)npeakout;
  npeakout_local = npeakanal;
  if ((npeakanal == 0) && (npeakout == 0)) {
    npeakout_local = 0x14;
    buf1 = (t_float *)0x0;
  }
  if (npeakout_local < 0) {
    npeakout_local = 0;
  }
  else if (100 < npeakout_local) {
    npeakout_local = 100;
  }
  if ((long)buf1 < 0) {
    buf1 = (t_float *)0x0;
  }
  else if (100 < (long)buf1) {
    buf1 = (t_float *)0x64;
  }
  if (npitch < 1) {
    npeakanal_local = 0;
  }
  else {
    npeakanal_local = npitch;
    if (3 < npitch) {
      npeakanal_local = 3;
    }
  }
  if ((npeakout_local != 0) && (npeakanal_local == 0)) {
    npeakanal_local = 1;
  }
  npitch_local = npoints;
  if (npoints == 0) {
    npitch_local = 0x400;
  }
  iVar1 = sigfiddle_setnpoints(x,(float)npitch_local);
  if (iVar1 == 0) {
    pd_error((void *)0x0,"fiddle~: out of memory");
    x_local._4_4_ = 0;
  }
  else {
    ptVar2 = (t_peakout *)getbytes((long)buf1 << 3);
    if (ptVar2 == (t_peakout *)0x0) {
      sigfiddle_freebird(x);
      pd_error((void *)0x0,"fiddle~: out of memory");
      x_local._4_4_ = 0;
    }
    else {
      for (local_5c = 0; (long)local_5c < (long)buf1; local_5c = local_5c + 1) {
        ptVar2[local_5c].po_amp = 0.0;
        ptVar2[local_5c].po_freq = 0.0;
      }
      x->x_peakbuf = ptVar2;
      x->x_npeakout = (int)buf1;
      x->x_npeakanal = (int)npeakout_local;
      x->x_phase = 0;
      x->x_histphase = 0;
      x->x_sr = 44100.0;
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        x->x_hist[local_5c].h_noted = 0.0;
        x->x_hist[local_5c].h_pitch = 0.0;
        x->x_hist[local_5c].h_age = 0;
        x->x_hist[local_5c].h_wherefrom = (t_histopeak *)0x0;
        x->x_hist[local_5c].h_outlet = (void *)0x0;
        for (local_60 = 0; local_60 < 0x14; local_60 = local_60 + 1) {
          x->x_hist[local_5c].h_pitches[local_60] = 0.0;
          x->x_hist[local_5c].h_amps[local_60] = 0.0;
        }
      }
      x->x_nprint = 0;
      x->x_npitch = (int)npeakanal_local;
      for (local_5c = 0; local_5c < 0x14; local_5c = local_5c + 1) {
        x->x_dbs[local_5c] = 0.0;
      }
      x->x_dbage = 0;
      x->x_peaked = 0.0;
      x->x_auto = 1;
      x->x_amplo = 40.0;
      x->x_amphi = 50.0;
      x->x_attacktime = 100;
      x->x_attackbins = 1;
      x->x_attackthresh = 10.0;
      x->x_vibtime = 0x32;
      x->x_vibbins = 1;
      x->x_vibdepth = 0.5;
      x->x_npartial = 7.0;
      x->x_attackvalue = 0;
      x_local._4_4_ = 1;
    }
  }
  return x_local._4_4_;
}

Assistant:

int sigfiddle_doinit(t_sigfiddle *x, long npoints, long npitch,
    long npeakanal, long npeakout)
{
    t_float *buf1, *buf2,  *buf3;
    t_peakout *buf4;
    int i;

    if (!npeakanal && !npeakout) npeakanal = DEFNPEAK, npeakout = 0;
    if (npeakanal < 0) npeakanal = 0;
    else if (npeakanal > MAXPEAK) npeakanal = MAXPEAK;
    if (npeakout < 0) npeakout = 0;
    else if (npeakout > MAXPEAK) npeakout = MAXPEAK;
    if (npitch <= 0) npitch = 0;
    else if (npitch > MAXNPITCH) npitch = MAXNPITCH;
    if (npeakanal && !npitch) npitch = 1;
    if (!npoints)
        npoints = DEFAULTPOINTS;
    if (!sigfiddle_setnpoints(x, npoints))
    {
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    if (!(buf4 = (t_peakout *)getbytes(sizeof(*buf4) * npeakout)))
    {
        sigfiddle_freebird(x);
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    for (i = 0; i < npeakout; i++)
        buf4[i].po_freq = buf4[i].po_amp = 0;
    x->x_peakbuf = buf4;

    x->x_npeakout = (int)npeakout;
    x->x_npeakanal = (int)npeakanal;
    x->x_phase = 0;
    x->x_histphase = 0;
    x->x_sr = 44100;            /* this and the next are filled in later */
    for (i = 0; i < MAXNPITCH; i++)
    {
        int j;
        x->x_hist[i].h_pitch = x->x_hist[i].h_noted = 0;
        x->x_hist[i].h_age = 0;
        x->x_hist[i].h_wherefrom = 0;
        x->x_hist[i].h_outlet = 0;
        for (j = 0; j < HISTORY; j++)
            x->x_hist[i].h_amps[j] = x->x_hist[i].h_pitches[j] = 0;
    }
    x->x_nprint = 0;
    x->x_npitch = (int)npitch;
    for (i = 0; i < HISTORY; i++) x->x_dbs[i] = 0;
    x->x_dbage = 0;
    x->x_peaked = 0;
    x->x_auto = 1;
    x->x_amplo = DEFAMPLO;
    x->x_amphi = DEFAMPHI;
    x->x_attacktime = DEFATTACKTIME;
    x->x_attackbins = 1;                /* real value calculated afterward */
    x->x_attackthresh = DEFATTACKTHRESH;
    x->x_vibtime = DEFVIBTIME;
    x->x_vibbins = 1;                   /* real value calculated afterward */
    x->x_vibdepth = DEFVIBDEPTH;
    x->x_npartial = 7;
    x->x_attackvalue = 0;
    return (1);
}